

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
TwoStageDynamicBayesianNetwork::GetNrVals_YSoI_O(TwoStageDynamicBayesianNetwork *this,Index oI)

{
  undefined8 uVar1;
  const_reference pvVar2;
  uint in_ESI;
  char *in_RDI;
  E *unaff_retaddr;
  
  if ((in_RDI[200] & 1U) == 0) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(unaff_retaddr,in_RDI);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         *)(in_RDI + 0x1c0),(ulong)in_ESI);
  return pvVar2;
}

Assistant:

const vector<size_t>& TwoStageDynamicBayesianNetwork::
GetNrVals_YSoI_O(Index oI) const
{
    if(!_m_ii_initialized)
        throw E("ii (influence instantiation) meta-info is not initialized");
    return _m_nrVals_YSoI_O[oI];
}